

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O1

void Prove_ParamsSetDefault(Prove_Params_t *pParams)

{
  pParams->fBddReorder = 0;
  pParams->nMiteringLimitLast = 0;
  pParams->nTotalBacktrackLimit = 0;
  pParams->nTotalInspectLimit = 0;
  pParams->nTotalBacktracksMade = 0;
  pParams->nTotalInspectsMade = 0;
  pParams->fUseFraiging = 1;
  pParams->fUseRewriting = 1;
  pParams->fUseBdds = 0;
  pParams->fVerbose = 0;
  pParams->nItersMax = 6;
  pParams->nMiteringLimitStart = 5000;
  pParams->nMiteringLimitMulti = 2.0;
  pParams->nRewritingLimitStart = 3;
  pParams->nRewritingLimitMulti = 1.0;
  pParams->nFraigingLimitStart = 2;
  pParams->nFraigingLimitMulti = 8.0;
  pParams->nBddSizeLimit = 1000000;
  pParams->fBddReorder = 1;
  *(undefined8 *)&pParams->nMiteringLimitLast = 0;
  *(undefined8 *)((long)&pParams->nTotalBacktrackLimit + 4) = 0;
  *(undefined4 *)((long)&pParams->nTotalInspectLimit + 4) = 0;
  return;
}

Assistant:

void Prove_ParamsSetDefault( Prove_Params_t * pParams )
{
    // clean the parameter structure 
    memset( pParams, 0, sizeof(Prove_Params_t) );
    // general parameters
    pParams->fUseFraiging         = 1;       // enables fraiging
    pParams->fUseRewriting        = 1;       // enables rewriting
    pParams->fUseBdds             = 0;       // enables BDD construction when other methods fail
    pParams->fVerbose             = 0;       // prints verbose stats
    // iterations
    pParams->nItersMax            = 6;       // the number of iterations
    // mitering 
    pParams->nMiteringLimitStart  = 5000;    // starting mitering limit
    pParams->nMiteringLimitMulti  = 2.0;     // multiplicative coefficient to increase the limit in each iteration
    // rewriting (currently not used)
    pParams->nRewritingLimitStart = 3;       // the number of rewriting iterations
    pParams->nRewritingLimitMulti = 1.0;     // multiplicative coefficient to increase the limit in each iteration
    // fraiging 
    pParams->nFraigingLimitStart  = 2;       // starting backtrack(conflict) limit
    pParams->nFraigingLimitMulti  = 8.0;     // multiplicative coefficient to increase the limit in each iteration
    // last-gasp BDD construction
    pParams->nBddSizeLimit        = 1000000; // the number of BDD nodes when construction is aborted
    pParams->fBddReorder          = 1;       // enables dynamic BDD variable reordering
    // last-gasp mitering
//    pParams->nMiteringLimitLast   = 1000000; // final mitering limit
    pParams->nMiteringLimitLast   = 0;       // final mitering limit
    // global SAT solver limits
    pParams->nTotalBacktrackLimit = 0;       // global limit on the number of backtracks
    pParams->nTotalInspectLimit   = 0;       // global limit on the number of clause inspects
//    pParams->nTotalInspectLimit   = 100000000;  // global limit on the number of clause inspects
}